

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorSetLayout.cpp
# Opt level: O2

Ptr<DescriptorSetLayout> __thiscall
myvk::DescriptorSetLayout::Create
          (DescriptorSetLayout *this,Ptr<Device> *device,
          vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
          *bindings)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  VkResult VVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr<DescriptorSetLayout> PVar3;
  shared_ptr<myvk::DescriptorSetLayout> ret;
  VkDescriptorSetLayoutCreateInfo local_48;
  
  std::make_shared<myvk::DescriptorSetLayout>();
  std::__shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((ret.super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->m_device_ptr).super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>,
             &device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>);
  local_48.pNext = (void *)0x0;
  local_48.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  local_48._4_4_ = 0;
  local_48.pBindings =
       (bindings->
       super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_48._16_8_ =
       ((long)(bindings->
              super__Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)local_48.pBindings) / 0x18 << 0x20
  ;
  VVar2 = (*vkCreateDescriptorSetLayout)
                    (((device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                     ->m_device,&local_48,(VkAllocationCallbacks *)0x0,
                     &(ret.super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_descriptor_set_layout);
  _Var1 = ret.super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (VVar2 == VK_SUCCESS) {
    ret.super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_DeviceObjectBase).super_Base._vptr_Base =
         (_func_int **)
         ret.super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var1._M_pi;
    ret.super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    (this->super_DeviceObjectBase).super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_DeviceObjectBase).super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
    .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ret.super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  PVar3.super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  PVar3.super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<DescriptorSetLayout>)
         PVar3.super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<DescriptorSetLayout> DescriptorSetLayout::Create(const Ptr<Device> &device,
                                                     const std::vector<VkDescriptorSetLayoutBinding> &bindings) {
	auto ret = std::make_shared<DescriptorSetLayout>();
	ret->m_device_ptr = device;

	VkDescriptorSetLayoutCreateInfo info = {};
	info.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
	info.bindingCount = bindings.size();
	info.pBindings = bindings.data();

	if (vkCreateDescriptorSetLayout(device->GetHandle(), &info, nullptr, &ret->m_descriptor_set_layout) != VK_SUCCESS)
		return nullptr;

	return ret;
}